

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O2

void __thiscall PenguinV_Image::ImageTemplate<signed_char>::clear(ImageTemplate<signed_char> *this)

{
  if (this->_data != (char *)0x0) {
    _deallocate(this,this->_data);
    this->_data = (char *)0x0;
  }
  this->_width = 0;
  this->_height = 0;
  this->_rowSize = 0;
  return;
}

Assistant:

void clear()
        {
            if( _data != nullptr ) {
                _deallocate( _data );
                _data = nullptr;
            }

            _width   = 0;
            _height  = 0;
            _rowSize = 0;
        }